

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::UnionType_abi_cxx11_
          (string *__return_storage_ptr__,PythonStubGenerator *this,EnumDef *enum_def,
          Imports *imports)

{
  Imports *imports_local;
  EnumDef *enum_def_local;
  PythonStubGenerator *this_local;
  
  UnionType<flatbuffers::python::(anonymous_namespace)::PythonStubGenerator::UnionType[abi:cxx11](flatbuffers::EnumDef_const&,flatbuffers::python::Imports*)const::_lambda(flatbuffers::StructDef_const&)_1_>
            (__return_storage_ptr__,this,enum_def,imports,(anon_class_8_1_8991fb9c)this);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionType(const EnumDef &enum_def, Imports *imports) const {
    return UnionType(enum_def, imports, [this](const StructDef &struct_def) {
      return namer_.Type(struct_def);
    });
  }